

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  
  iVar8 = (this->_Path).Size;
  if ((radius != 0.0) || (NAN(radius))) {
    iVar8 = num_segments + iVar8 + 1;
    if ((this->_Path).Capacity < iVar8) {
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
      pIVar6 = (this->_Path).Data;
      if (pIVar6 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar6,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar8;
    }
    if (-1 < num_segments) {
      iVar8 = 0;
      do {
        fVar11 = ((float)iVar8 / (float)num_segments) * (a_max - a_min) + a_min;
        fVar1 = centre->x;
        fVar10 = cosf(fVar11);
        fVar2 = centre->y;
        fVar11 = sinf(fVar11);
        iVar7 = (this->_Path).Size;
        if (iVar7 == (this->_Path).Capacity) {
          if (iVar7 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = iVar7 / 2 + iVar7;
          }
          iVar9 = iVar7 + 1;
          if (iVar7 + 1 < iVar4) {
            iVar9 = iVar4;
          }
          pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
          pIVar5 = (this->_Path).Data;
          if (pIVar5 != (ImVec2 *)0x0) {
            memcpy(pIVar6,pIVar5,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = pIVar6;
          (this->_Path).Capacity = iVar9;
          iVar7 = (this->_Path).Size;
        }
        else {
          pIVar6 = (this->_Path).Data;
        }
        IVar3.y = fVar2 + fVar11 * radius;
        IVar3.x = fVar1 + fVar10 * radius;
        pIVar6[iVar7] = IVar3;
        (this->_Path).Size = (this->_Path).Size + 1;
        iVar8 = iVar8 + 1;
      } while (num_segments + 1 != iVar8);
    }
  }
  else {
    if (iVar8 == (this->_Path).Capacity) {
      if (iVar8 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar8 / 2 + iVar8;
      }
      iVar4 = iVar8 + 1;
      if (iVar8 + 1 < iVar7) {
        iVar4 = iVar7;
      }
      pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar5,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar4;
      iVar8 = (this->_Path).Size;
    }
    else {
      pIVar6 = (this->_Path).Data;
    }
    pIVar6[iVar8] = *centre;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float a_min, float a_max, int num_segments)
{
    if (radius == 0.0f)
    {
        _Path.push_back(centre);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(centre.x + ImCos(a) * radius, centre.y + ImSin(a) * radius));
    }
}